

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uchar paethPredictor(short a,short b,short c)

{
  short sVar1;
  short sVar2;
  undefined2 local_1a;
  short pc;
  short pb;
  short pa;
  short c_local;
  short b_local;
  short a_local;
  
  if ((int)b - (int)c < 0) {
    pa = -(b - c);
  }
  else {
    pa = b - c;
  }
  if ((int)a - (int)c < 0) {
    sVar1 = -(a - c);
  }
  else {
    sVar1 = a - c;
  }
  if ((((int)a + (int)b) - (int)c) - (int)c < 0) {
    sVar2 = -(a + b + c * -2);
  }
  else {
    sVar2 = a + b + c * -2;
  }
  a_local = a;
  if (sVar1 < pa) {
    pa = sVar1;
    a_local = b;
  }
  local_1a = c;
  if (pa <= sVar2) {
    local_1a = a_local;
  }
  return (uchar)local_1a;
}

Assistant:

static unsigned char paethPredictor(short a, short b, short c) {
  short pa = LODEPNG_ABS(b - c);
  short pb = LODEPNG_ABS(a - c);
  short pc = LODEPNG_ABS(a + b - c - c);
  /* return input value associated with smallest of pa, pb, pc (with certain priority if equal) */
  if(pb < pa) { a = b; pa = pb; }
  return (pc < pa) ? c : a;
}